

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

string * __thiscall
flatbuffers::ts::TsGenerator::GenWriteMethod_abi_cxx11_
          (string *__return_storage_ptr__,TsGenerator *this,Type *type)

{
  bool bVar1;
  bool bVar2;
  Type *type_00;
  char *local_138;
  allocator<char> local_f5 [20];
  byte local_e1;
  string local_e0;
  Type local_c0;
  Type local_a0;
  Type local_80;
  Type local_60;
  Type local_40;
  TsGenerator *local_20;
  Type *type_local;
  TsGenerator *this_local;
  
  local_20 = (TsGenerator *)type;
  type_local = (Type *)this;
  this_local = (TsGenerator *)__return_storage_ptr__;
  switch(type->base_type) {
  case BASE_TYPE_UTYPE:
    GetUnionUnderlyingType(&local_40,type);
    GenWriteMethod_abi_cxx11_(__return_storage_ptr__,this,&local_40);
    break;
  default:
    bVar1 = IsScalar(type->base_type);
    local_e1 = 0;
    bVar2 = false;
    if (bVar1) {
      GenType_abi_cxx11_(&local_e0,local_20,type_00);
      local_e1 = 1;
      Namer::Type(__return_storage_ptr__,&(this->namer_).super_Namer,&local_e0);
    }
    else {
      bVar2 = IsStruct((Type *)local_20);
      if (bVar2) {
        local_138 = "Struct";
      }
      else {
        local_138 = "Offset";
      }
      std::allocator<char>::allocator();
      bVar2 = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,local_138,local_f5);
    }
    if (bVar2) {
      std::allocator<char>::~allocator(local_f5);
    }
    if ((local_e1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_e0);
    }
    break;
  case BASE_TYPE_UCHAR:
    Type::Type(&local_60,BASE_TYPE_CHAR,(StructDef *)0x0,(EnumDef *)0x0,0);
    GenWriteMethod_abi_cxx11_(__return_storage_ptr__,this,&local_60);
    break;
  case BASE_TYPE_USHORT:
    Type::Type(&local_80,BASE_TYPE_SHORT,(StructDef *)0x0,(EnumDef *)0x0,0);
    GenWriteMethod_abi_cxx11_(__return_storage_ptr__,this,&local_80);
    break;
  case BASE_TYPE_UINT:
    Type::Type(&local_a0,BASE_TYPE_INT,(StructDef *)0x0,(EnumDef *)0x0,0);
    GenWriteMethod_abi_cxx11_(__return_storage_ptr__,this,&local_a0);
    break;
  case BASE_TYPE_ULONG:
    Type::Type(&local_c0,BASE_TYPE_LONG,(StructDef *)0x0,(EnumDef *)0x0,0);
    GenWriteMethod_abi_cxx11_(__return_storage_ptr__,this,&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenWriteMethod(const Type &type) {
    // Forward to signed versions since unsigned versions don't exist
    switch (type.base_type) {
      case BASE_TYPE_UTYPE: return GenWriteMethod(GetUnionUnderlyingType(type));
      case BASE_TYPE_UCHAR: return GenWriteMethod(Type(BASE_TYPE_CHAR));
      case BASE_TYPE_USHORT: return GenWriteMethod(Type(BASE_TYPE_SHORT));
      case BASE_TYPE_UINT: return GenWriteMethod(Type(BASE_TYPE_INT));
      case BASE_TYPE_ULONG: return GenWriteMethod(Type(BASE_TYPE_LONG));
      default: break;
    }

    return IsScalar(type.base_type) ? namer_.Type(GenType(type))
                                    : (IsStruct(type) ? "Struct" : "Offset");
  }